

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O2

uint __thiscall crnlib::dxt5_block::get_selector(dxt5_block *this,uint x,uint y)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (x + y * 4) * 3;
  uVar2 = (uint)this->m_selectors[uVar1 >> 3];
  if (uVar1 < 0x28) {
    uVar2 = (uint)CONCAT11(this->m_selectors[(ulong)(uVar1 >> 3) + 1],this->m_selectors[uVar1 >> 3])
    ;
  }
  return uVar2 >> ((byte)uVar1 & 7) & 7;
}

Assistant:

inline uint get_selector(uint x, uint y) const
        {
            CRNLIB_ASSERT((x < 4U) && (y < 4U));

            uint selector_index = (y * 4) + x;
            uint bit_index = selector_index * cDXT5SelectorBits;

            uint byte_index = bit_index >> 3;
            uint bit_ofs = bit_index & 7;

            uint v = m_selectors[byte_index];
            if (byte_index < (cNumSelectorBytes - 1))
            {
                v |= (m_selectors[byte_index + 1] << 8);
            }

            return (v >> bit_ofs) & 7;
        }